

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void check_duplex<float>(float *input_buffer,float *output_buffer,long frame_count,
                        int input_channel_count)

{
  undefined4 uVar1;
  bool bVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int i;
  int input_index;
  int output_index;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  bool *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar3;
  undefined4 in_stack_ffffffffffffff18;
  int iVar4;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar5;
  char *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  Type in_stack_ffffffffffffff3c;
  AssertHelper *in_stack_ffffffffffffff40;
  AssertionResult local_a8;
  string local_98 [8];
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  AssertionResult *in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  AssertionResult local_60;
  uint local_4c;
  undefined4 local_34;
  AssertionResult local_30;
  int local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  local_34 = 0x100;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20,
             (long *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff40);
    testing::AssertionResult::failure_message((AssertionResult *)0x115f9b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    testing::Message::~Message((Message *)0x115feb);
  }
  local_4c = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x116010);
  if (local_4c == 0) {
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08,(type *)0x116054);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      std::__cxx11::string::~string(local_98);
      testing::Message::~Message((Message *)0x116104);
    }
    local_4c = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x116129);
    if (local_4c == 0) {
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08,(type *)0x116164);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff40);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
        testing::Message::~Message((Message *)0x1161fc);
      }
      local_4c = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x11621e);
      if (local_4c == 0) {
        iVar5 = 0;
        iVar4 = 0;
        for (iVar3 = 0; iVar3 < local_18; iVar3 = iVar3 + 1) {
          if (local_1c == 1) {
            uVar1 = *(undefined4 *)(local_8 + (long)iVar3 * 4);
            *(undefined4 *)(local_10 + (long)(iVar5 + 1) * 4) = uVar1;
            *(undefined4 *)(local_10 + (long)iVar5 * 4) = uVar1;
          }
          else if (local_1c == 2) {
            *(undefined4 *)(local_10 + (long)iVar5 * 4) = *(undefined4 *)(local_8 + (long)iVar4 * 4)
            ;
            *(undefined4 *)(local_10 + (long)(iVar5 + 1) * 4) =
                 *(undefined4 *)(local_8 + (long)(iVar4 + 1) * 4);
          }
          iVar5 = iVar5 + 2;
          iVar4 = local_1c + iVar4;
        }
      }
    }
  }
  return;
}

Assistant:

void
check_duplex(const T * input_buffer, T * output_buffer, long frame_count,
             int input_channel_count)
{
  ASSERT_EQ(frame_count, 256);
  // Silence scan-build warning.
  ASSERT_TRUE(!!output_buffer);
  assert(output_buffer);
  ASSERT_TRUE(!!input_buffer);
  assert(input_buffer);

  int output_index = 0;
  int input_index = 0;
  for (int i = 0; i < frame_count; i++) {
    // output is two channels, input one or two channels.
    if (input_channel_count == 1) {
      output_buffer[output_index] = output_buffer[output_index + 1] =
          input_buffer[i];
    } else if (input_channel_count == 2) {
      output_buffer[output_index] = input_buffer[input_index];
      output_buffer[output_index + 1] = input_buffer[input_index + 1];
    }
    output_index += 2;
    input_index += input_channel_count;
  }
}